

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O2

bool __thiscall
jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::
visit_byte_string(basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_> *this
                 ,byte_string_view *b,semantic_tag tag,ser_context *param_3,error_code *param_4)

{
  stream_sink<char> *this_00;
  size_t *psVar1;
  byte_string_chars_format bVar2;
  uchar *first;
  pointer peVar3;
  type_conflict2 tVar4;
  byte_string_chars_format bVar5;
  byte_string_chars_format bVar6;
  uchar *last;
  
  peVar3 = (this->stack_).
           super__Vector_base<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->stack_).
      super__Vector_base<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
      ._M_impl.super__Vector_impl_data._M_start != peVar3) {
    if (peVar3[-1].type_ == array) {
      begin_scalar_value(this);
      peVar3 = (this->stack_).
               super__Vector_base<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    if ((peVar3[-1].line_splits_ != multi_line) &&
       ((this->options_).line_length_limit_ <= this->column_)) {
      break_line(this);
    }
  }
  bVar5 = (byte_string_chars_format)(0x300000201 >> ((tag - base16) * '\b' & 0x3f));
  if (4 < (byte)(tag - base16)) {
    bVar5 = none;
  }
  bVar2 = (this->options_).byte_string_format_;
  bVar6 = base64url;
  if ((byte)(bVar5 - base16) < 3) {
    bVar6 = bVar5;
  }
  if ((byte)(bVar2 - base16) < 3) {
    bVar6 = bVar2;
  }
  this_00 = &this->sink_;
  stream_sink<char>::push_back(this_00,'\"');
  first = b->data_;
  last = first + b->size_;
  if (bVar6 == base64url) {
    tVar4 = encode_base64url<unsigned_char_const*,jsoncons::stream_sink<char>>(first,last,this_00);
  }
  else if (bVar6 == base64) {
    tVar4 = encode_base64<unsigned_char_const*,jsoncons::stream_sink<char>>(first,last,this_00);
  }
  else {
    tVar4 = encode_base16<unsigned_char_const*,jsoncons::stream_sink<char>>(first,last,this_00);
  }
  stream_sink<char>::push_back(this_00,'\"');
  this->column_ = this->column_ + tVar4 + 2;
  peVar3 = (this->stack_).
           super__Vector_base<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->stack_).
      super__Vector_base<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
      ._M_impl.super__Vector_impl_data._M_start != peVar3) {
    psVar1 = &peVar3[-1].count_;
    *psVar1 = *psVar1 + 1;
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_byte_string(const byte_string_view& b, 
                                  semantic_tag tag,
                                  const ser_context&,
                                  std::error_code&) final
        {
            if (!stack_.empty()) 
            {
                if (stack_.back().is_array())
                {
                    begin_scalar_value();
                }
                if (!stack_.back().is_multi_line() && column_ >= options_.line_length_limit())
                {
                    break_line();
                }
            }

            byte_string_chars_format encoding_hint;
            switch (tag)
            {
                case semantic_tag::base16:
                    encoding_hint = byte_string_chars_format::base16;
                    break;
                case semantic_tag::base64:
                    encoding_hint = byte_string_chars_format::base64;
                    break;
                case semantic_tag::base64url:
                    encoding_hint = byte_string_chars_format::base64url;
                    break;
                default:
                    encoding_hint = byte_string_chars_format::none;
                    break;
            }

            byte_string_chars_format format = jsoncons::detail::resolve_byte_string_chars_format(options_.byte_string_format(), 
                                                                                                 encoding_hint, 
                                                                                                 byte_string_chars_format::base64url);
            switch (format)
            {
                case byte_string_chars_format::base16:
                {
                    sink_.push_back('\"');
                    std::size_t length = encode_base16(b.begin(),b.end(),sink_);
                    sink_.push_back('\"');
                    column_ += (length + 2);
                    break;
                }
                case byte_string_chars_format::base64:
                {
                    sink_.push_back('\"');
                    std::size_t length = encode_base64(b.begin(), b.end(), sink_);
                    sink_.push_back('\"');
                    column_ += (length + 2);
                    break;
                }
                case byte_string_chars_format::base64url:
                {
                    sink_.push_back('\"');
                    std::size_t length = encode_base64url(b.begin(),b.end(),sink_);
                    sink_.push_back('\"');
                    column_ += (length + 2);
                    break;
                }
                default:
                {
                    JSONCONS_UNREACHABLE();
                }
            }

            end_value();
            JSONCONS_VISITOR_RETURN;
        }